

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_commit.cxx
# Opt level: O2

void __thiscall
nuraft::raft_server::on_snapshot_completed
          (raft_server *this,ptr<snapshot> *s,bool result,ptr<std::exception> *err)

{
  element_type *peVar1;
  element_type *peVar2;
  element_type *peVar3;
  int iVar4;
  undefined8 uVar5;
  _Head_base<1UL,_unsigned_long,_false> _Var6;
  handler_type handler;
  ptr<snapshot> new_snp;
  ptr<raft_params> params;
  unique_lock<std::recursive_mutex> guard;
  undefined1 local_38 [16];
  _Tuple_impl<1UL,_unsigned_long,_std::_Placeholder<1>,_std::_Placeholder<2>_> local_28;
  _Head_base<0UL,_nuraft::raft_server_*,_false> local_20;
  
  if ((err->super___shared_ptr<std::exception,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
      (element_type *)0x0) {
    if (result) {
      std::unique_lock<std::recursive_mutex>::unique_lock(&guard,&this->lock_);
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar1 != (element_type *)0x0) {
        iVar4 = (*peVar1->_vptr_logger[7])();
        if (3 < iVar4) {
          peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          peVar2 = (s->super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          msg_if_given_abi_cxx11_
                    ((string *)&handler,
                     "snapshot idx %lu log_term %lu created, compact the log store if needed",
                     peVar2->last_log_idx_,peVar2->last_log_term_);
          (*peVar1->_vptr_logger[8])
                    (peVar1,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                     ,"on_snapshot_completed",0x265,&handler);
          std::__cxx11::string::~string((string *)&handler);
        }
      }
      (*((this->state_machine_).
         super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        _vptr_state_machine[0x10])(&new_snp);
      set_last_snapshot(this,&new_snp);
      nuraft::context::get_params((context *)&params);
      _Var6._M_head_impl =
           (new_snp.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           last_log_idx_ -
           (long)(params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                 ->reserved_log_items_;
      if ((ulong)(long)(params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->reserved_log_items_ <=
          (new_snp.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          last_log_idx_ && (element_type *)_Var6._M_head_impl != (element_type *)0x0) {
        peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (peVar1 != (element_type *)0x0) {
          iVar4 = (*peVar1->_vptr_logger[7])();
          if (3 < iVar4) {
            peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            msg_if_given_abi_cxx11_
                      ((string *)&handler,"log_store_ compact upto %lu",_Var6._M_head_impl);
            (*peVar1->_vptr_logger[8])
                      (peVar1,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                       ,"on_snapshot_completed",0x26e,&handler);
            std::__cxx11::string::~string((string *)&handler);
          }
        }
        local_38._0_8_ = on_log_compacted;
        local_38._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_28.super__Head_base<1UL,_unsigned_long,_false>._M_head_impl =
             (_Head_base<1UL,_unsigned_long,_false>)
             (_Head_base<1UL,_unsigned_long,_false>)_Var6._M_head_impl;
        local_20._M_head_impl = this;
        std::function<void(bool&,std::shared_ptr<std::exception>&)>::
        function<std::_Bind<void(nuraft::raft_server::*(nuraft::raft_server*,unsigned_long,std::_Placeholder<1>,std::_Placeholder<2>))(unsigned_long,bool,std::shared_ptr<std::exception>&)>,void>
                  ((function<void(bool&,std::shared_ptr<std::exception>&)> *)&handler,
                   (_Bind<void_(nuraft::raft_server::*(nuraft::raft_server_*,_unsigned_long,_std::_Placeholder<1>,_std::_Placeholder<2>))(unsigned_long,_bool,_std::shared_ptr<std::exception>_&)>
                    *)local_38);
        peVar3 = (this->log_store_).
                 super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        (*peVar3->_vptr_log_store[0xf])(peVar3,_Var6._M_head_impl,&handler);
        std::_Function_base::~_Function_base(&handler.super__Function_base);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&new_snp.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::unique_lock<std::recursive_mutex>::~unique_lock(&guard);
      goto LAB_00195cef;
    }
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar1 == (element_type *)0x0) goto LAB_00195cef;
    iVar4 = (*peVar1->_vptr_logger[7])();
    if (iVar4 < 4) goto LAB_00195cef;
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    msg_if_given_abi_cxx11_((string *)&handler,"the state machine rejects to create the snapshot");
    (*peVar1->_vptr_logger[8])
              (peVar1,4,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
               ,"on_snapshot_completed",0x25d,&handler);
  }
  else {
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar1 == (element_type *)0x0) goto LAB_00195cef;
    iVar4 = (*peVar1->_vptr_logger[7])();
    if (iVar4 < 2) goto LAB_00195cef;
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar5 = (**(code **)(*(long *)(err->
                                  super___shared_ptr<std::exception,_(__gnu_cxx::_Lock_policy)2>).
                                  _M_ptr + 0x10))();
    msg_if_given_abi_cxx11_((string *)&handler,"failed to create a snapshot due to %s",uVar5);
    (*peVar1->_vptr_logger[8])
              (peVar1,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
               ,"on_snapshot_completed",600,&handler);
  }
  std::__cxx11::string::~string((string *)&handler);
LAB_00195cef:
  LOCK();
  (this->snp_in_progress_)._M_base._M_i = false;
  UNLOCK();
  return;
}

Assistant:

void raft_server::on_snapshot_completed
     ( ptr<snapshot>& s, bool result, ptr<std::exception>& err )
{
 do { // Dummy loop
    if (err != nilptr) {
        p_er( "failed to create a snapshot due to %s",
              err->what() );
        break;
    }

    if (!result) {
        p_in("the state machine rejects to create the snapshot");
        break;
    }

    {
        recur_lock(lock_);
        p_in("snapshot idx %" PRIu64 " log_term %" PRIu64 " created, "
             "compact the log store if needed",
             s->get_last_log_idx(), s->get_last_log_term());

        ptr<snapshot> new_snp = state_machine_->last_snapshot();
        set_last_snapshot(new_snp);
        ptr<raft_params> params = ctx_->get_params();
        if ( new_snp->get_last_log_idx() >
                 (ulong)params->reserved_log_items_ ) {
            ulong compact_upto = new_snp->get_last_log_idx() -
                                     (ulong)params->reserved_log_items_;
            p_in("log_store_ compact upto %" PRIu64 "", compact_upto);

            cmd_result<bool>::handler_type handler =
                (cmd_result<bool>::handler_type)
                std::bind( &raft_server::on_log_compacted,
                           this,
                           compact_upto,
                           std::placeholders::_1,
                           std::placeholders::_2 );

            log_store_->compact_async(compact_upto, handler);
        }
    }
 } while (false);

    snp_in_progress_.store(false);
}